

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O1

bool __thiscall FConfigFile::SetNextSection(FConfigFile *this)

{
  FConfigSection *pFVar1;
  
  if (this->CurrentSection != (FConfigSection *)0x0) {
    pFVar1 = this->CurrentSection->Next;
    this->CurrentSection = pFVar1;
    if (pFVar1 != (FConfigSection *)0x0) {
      this->CurrentEntry = pFVar1->RootEntry;
      return true;
    }
  }
  return false;
}

Assistant:

bool FConfigFile::SetNextSection ()
{
	if (CurrentSection != NULL)
	{
		CurrentSection = CurrentSection->Next;
		if (CurrentSection != NULL)
		{
			CurrentEntry = CurrentSection->RootEntry;
			return true;
		}
	}
	return false;
}